

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu.c
# Opt level: O1

RK_U32 VPUCheckSupportWidth(void)

{
  int socket;
  RK_S32 RVar1;
  VPUHwDecConfig_t hwCfg;
  RK_U32 local_58 [20];
  
  socket = open("/dev/vpu_service",0x80002);
  if (socket < 0) {
    socket = open("/dev/vpu-service",0x80002);
  }
  local_58[0x10] = 0;
  local_58[0x11] = 0;
  local_58[0x12] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  if (-1 < socket) {
    RVar1 = VPUClientGetHwCfg(socket,local_58,0x4c);
    if (RVar1 != 0) {
      _mpp_log_l(2,"vpu","Get HwCfg failed\n","VPUCheckSupportWidth");
      close(socket);
      return 0xffffffff;
    }
    close(socket);
  }
  return local_58[0];
}

Assistant:

RK_U32 VPUCheckSupportWidth()
{
    VPUHwDecConfig_t hwCfg;
    int fd = -1;
    fd = open("/dev/vpu_service", O_RDWR | O_CLOEXEC);
    if (fd < 0) {
        fd = open("/dev/vpu-service", O_RDWR | O_CLOEXEC);
    }
    memset(&hwCfg, 0, sizeof(VPUHwDecConfig_t));
    if (fd >= 0) {
        if (VPUClientGetHwCfg(fd, (RK_U32*)&hwCfg, sizeof(hwCfg))) {
            mpp_err_f("Get HwCfg failed\n");
            close(fd);
            return -1;
        }
        close(fd);
        fd = -1;
    }
    return hwCfg.maxDecPicWidth;
}